

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

RequiredError *
CLI::RequiredError::Option
          (RequiredError *__return_storage_ptr__,size_t min_option,size_t max_option,size_t used,
          string *option_list)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_t sVar9;
  uint uVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar4 = min_option ^ 1;
  if (((max_option ^ 1) == 0 && uVar4 == 0) && used == 0) {
    ::std::operator+(&local_1d0,"Exactly 1 option from [",option_list);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1d0,"]");
    local_50._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar6) {
      local_50.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_50._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    RequiredError(__return_storage_ptr__,&local_50);
    uVar11 = local_50.field_2._M_allocated_capacity;
    _Var12._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_001ba4e0:
      operator_delete(_Var12._M_p,uVar11 + 1);
    }
LAB_001ba4e8:
    local_130.field_2._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
    _Var12._M_p = local_1d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001bb0e1;
  }
  if (((max_option ^ 1) != 0 || uVar4 != 0) || used < 2) {
    if (uVar4 == 0 && used == 0) {
      ::std::operator+(&local_1d0,"At least 1 option from [",option_list);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1d0,"]");
      local_90._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar6) {
        local_90.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_90._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      RequiredError(__return_storage_ptr__,&local_90);
      uVar11 = local_90.field_2._M_allocated_capacity;
      _Var12._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_001ba4e0;
      goto LAB_001ba4e8;
    }
    if (used < min_option) {
      uVar10 = 1;
      if (9 < min_option) {
        sVar9 = min_option;
        uVar3 = 4;
        do {
          uVar10 = uVar3;
          if (sVar9 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_001ba948;
          }
          if (sVar9 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_001ba948;
          }
          if (sVar9 < 10000) goto LAB_001ba948;
          bVar2 = 99999 < sVar9;
          sVar9 = sVar9 / 10000;
          uVar3 = uVar10 + 4;
        } while (bVar2);
        uVar10 = uVar10 + 1;
      }
LAB_001ba948:
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_130,(ulong)uVar10,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_130._M_dataplus._M_p,(uint)local_130._M_string_length,min_option);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_130,0,0,"Requires at least ",0x12);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if (paVar6 == paVar7) {
        local_110.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_110._M_dataplus._M_p = (pointer)paVar6;
      }
      local_110._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_110," options used but only ");
      local_1b0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p == paVar6) {
        local_1b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_1b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      }
      else {
        local_1b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_1b0._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      uVar10 = 1;
      if (9 < used) {
        sVar9 = used;
        uVar3 = 4;
        do {
          uVar10 = uVar3;
          if (sVar9 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_001baa9a;
          }
          if (sVar9 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_001baa9a;
          }
          if (sVar9 < 10000) goto LAB_001baa9a;
          bVar2 = 99999 < sVar9;
          sVar9 = sVar9 / 10000;
          uVar3 = uVar10 + 4;
        } while (bVar2);
        uVar10 = uVar10 + 1;
      }
LAB_001baa9a:
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_170,(ulong)uVar10,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_170._M_dataplus._M_p,(uint)local_170._M_string_length,used);
      uVar4 = CONCAT44(local_170._M_string_length._4_4_,(uint)local_170._M_string_length) +
              local_1b0._M_string_length;
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        uVar11 = local_1b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < uVar4) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          uVar11 = local_170.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < uVar4) goto LAB_001bab07;
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_170,0,0,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      }
      else {
LAB_001bab07:
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_1b0,local_170._M_dataplus._M_p,
                           CONCAT44(local_170._M_string_length._4_4_,
                                    (uint)local_170._M_string_length));
      }
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if (paVar7 == paVar6) {
        local_190.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_190.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_190._M_dataplus._M_p = (pointer)paVar7;
      }
      local_190._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      paVar6->_M_local_buf[0] = '\0';
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_190," were given from [");
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if (paVar6 == paVar7) {
        local_150.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_150.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_150.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_150._M_dataplus._M_p = (pointer)paVar6;
      }
      local_150._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_150,(option_list->_M_dataplus)._M_p,option_list->_M_string_length);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if (paVar6 == paVar7) {
        local_1d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_1d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_1d0._M_dataplus._M_p = (pointer)paVar6;
      }
      local_1d0._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1d0,"]");
      local_b0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar6) {
        local_b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_b0._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      RequiredError(__return_storage_ptr__,&local_b0,RequiredError);
      uVar11 = local_b0.field_2._M_allocated_capacity;
      _Var12._M_p = local_b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_001bb01d:
        operator_delete(_Var12._M_p,uVar11 + 1);
      }
    }
    else {
      if (max_option == 1) {
        ::std::operator+(&local_1d0,"Requires at most 1 options be given from [",option_list);
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_1d0,"]");
        local_d0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar6 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == paVar6) {
          local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        local_d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        RequiredError(__return_storage_ptr__,&local_d0,RequiredError);
        uVar11 = local_d0.field_2._M_allocated_capacity;
        _Var12._M_p = local_d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_001ba4e0;
        goto LAB_001ba4e8;
      }
      uVar10 = 1;
      if (9 < max_option) {
        sVar9 = max_option;
        uVar3 = 4;
        do {
          uVar10 = uVar3;
          if (sVar9 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_001bacbb;
          }
          if (sVar9 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_001bacbb;
          }
          if (sVar9 < 10000) goto LAB_001bacbb;
          bVar2 = 99999 < sVar9;
          sVar9 = sVar9 / 10000;
          uVar3 = uVar10 + 4;
        } while (bVar2);
        uVar10 = uVar10 + 1;
      }
LAB_001bacbb:
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_130,(ulong)uVar10,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_130._M_dataplus._M_p,(uint)local_130._M_string_length,max_option);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_130,0,0,"Requires at most ",0x11);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if (paVar6 == paVar7) {
        local_110.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_110._M_dataplus._M_p = (pointer)paVar6;
      }
      local_110._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_110," options be used but ");
      local_1b0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p == paVar6) {
        local_1b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_1b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      }
      else {
        local_1b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_1b0._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      uVar10 = 1;
      if (9 < used) {
        sVar9 = used;
        uVar3 = 4;
        do {
          uVar10 = uVar3;
          if (sVar9 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_001bae0c;
          }
          if (sVar9 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_001bae0c;
          }
          if (sVar9 < 10000) goto LAB_001bae0c;
          bVar2 = 99999 < sVar9;
          sVar9 = sVar9 / 10000;
          uVar3 = uVar10 + 4;
        } while (bVar2);
        uVar10 = uVar10 + 1;
      }
LAB_001bae0c:
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_170,(ulong)uVar10,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_170._M_dataplus._M_p,(uint)local_170._M_string_length,used);
      uVar4 = CONCAT44(local_170._M_string_length._4_4_,(uint)local_170._M_string_length) +
              local_1b0._M_string_length;
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        uVar11 = local_1b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < uVar4) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          uVar11 = local_170.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < uVar4) goto LAB_001bae79;
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_170,0,0,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      }
      else {
LAB_001bae79:
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_1b0,local_170._M_dataplus._M_p,
                           CONCAT44(local_170._M_string_length._4_4_,
                                    (uint)local_170._M_string_length));
      }
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if (paVar7 == paVar6) {
        local_190.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_190.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_190._M_dataplus._M_p = (pointer)paVar7;
      }
      local_190._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      paVar6->_M_local_buf[0] = '\0';
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_190," were given from [");
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if (paVar6 == paVar7) {
        local_150.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_150.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_150.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_150._M_dataplus._M_p = (pointer)paVar6;
      }
      local_150._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_150,(option_list->_M_dataplus)._M_p,option_list->_M_string_length);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if (paVar6 == paVar7) {
        local_1d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_1d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_1d0._M_dataplus._M_p = (pointer)paVar6;
      }
      local_1d0._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1d0,"]");
      local_f0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == paVar6) {
        local_f0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_f0._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      RequiredError(__return_storage_ptr__,&local_f0,RequiredError);
      uVar11 = local_f0.field_2._M_allocated_capacity;
      _Var12._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_001bb01d;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    _Var12._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001bb0e1;
  }
  ::std::operator+(&local_190,"Exactly 1 option from [",option_list);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_190,"] is required but ");
  paVar6 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p == paVar7) {
    local_150.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_150.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_150._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
    local_150.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_150._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  uVar10 = 1;
  if (9 < used) {
    sVar9 = used;
    uVar3 = 4;
    do {
      uVar10 = uVar3;
      if (sVar9 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_001ba6b8;
      }
      if (sVar9 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_001ba6b8;
      }
      if (sVar9 < 10000) goto LAB_001ba6b8;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      uVar3 = uVar10 + 4;
    } while (bVar2);
    uVar10 = uVar10 + 1;
  }
LAB_001ba6b8:
  paVar7 = &local_1b0.field_2;
  local_1b0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_1b0,(ulong)uVar10,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_1b0._M_dataplus._M_p,(uint)local_1b0._M_string_length,used);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar6) {
    uVar11 = local_150.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_1b0._M_string_length + local_150._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != paVar7) {
      uVar11 = local_1b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1b0._M_string_length + local_150._M_string_length) goto LAB_001ba72a;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1b0,0,0,local_150._M_dataplus._M_p,local_150._M_string_length);
  }
  else {
LAB_001ba72a:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_150,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if (paVar1 == paVar8) {
    local_1d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_1d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1d0._M_dataplus._M_p = (pointer)paVar1;
  }
  local_1d0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1d0," were given");
  local_70._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar8) {
    local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  RequiredError(__return_storage_ptr__,&local_70,RequiredError);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar6) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_130.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
  _Var12._M_p = local_190._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p == &local_190.field_2) {
    return __return_storage_ptr__;
  }
LAB_001bb0e1:
  operator_delete(_Var12._M_p,local_130.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

static RequiredError
    Option(std::size_t min_option, std::size_t max_option, std::size_t used, const std::string &option_list) {
        if((min_option == 1) && (max_option == 1) && (used == 0))
            return RequiredError("Exactly 1 option from [" + option_list + "]");
        if((min_option == 1) && (max_option == 1) && (used > 1)) {
            return {"Exactly 1 option from [" + option_list + "] is required but " + std::to_string(used) +
                        " were given",
                    ExitCodes::RequiredError};
        }
        if((min_option == 1) && (used == 0))
            return RequiredError("At least 1 option from [" + option_list + "]");
        if(used < min_option) {
            return {"Requires at least " + std::to_string(min_option) + " options used but only " +
                        std::to_string(used) + " were given from [" + option_list + "]",
                    ExitCodes::RequiredError};
        }
        if(max_option == 1)
            return {"Requires at most 1 options be given from [" + option_list + "]", ExitCodes::RequiredError};

        return {"Requires at most " + std::to_string(max_option) + " options be used but " + std::to_string(used) +
                    " were given from [" + option_list + "]",
                ExitCodes::RequiredError};
    }